

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<c___pedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,undefined8 *params,long params_1,
          long params_2,long params_3,long params_4,long params_5,long params_6,long params_7,
          undefined8 *params_8,long params_9,undefined8 *params_10,long params_11,long params_12,
          long params_13,long params_14,long params_15,long params_16,long params_17,
          undefined8 *params_18,long params_19,undefined8 *params_20,undefined8 *params_21,
          long params_22,long params_23,long params_24,long params_25,long params_26,long params_27,
          long params_28,long params_29,long params_30,long params_31,long params_32,
          undefined8 *params_33,long params_34,long params_35,long params_36,undefined8 *params_37,
          long params_38,long params_39,long params_40,long params_41,long params_42,long params_43,
          long params_44,long params_45,long params_46,long params_47,long params_48,
          undefined8 *params_49,long params_50,long params_51,long params_52,undefined8 *params_53,
          undefined8 *params_54,long params_55,long params_56,long params_57,long params_58,
          long params_59,long params_60,long params_61,long params_62,long params_63,long params_64,
          long params_65)

{
  long lVar1;
  size_t sVar2;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *pcVar3;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  undefined8 *in_stack_000001f8;
  long in_stack_00000200;
  undefined8 *in_stack_00000208;
  undefined8 *in_stack_00000210;
  undefined8 *in_stack_00000218;
  undefined8 *in_stack_00000220;
  long in_stack_00000228;
  long in_stack_00000230;
  long in_stack_00000238;
  long in_stack_00000240;
  long in_stack_00000248;
  long in_stack_00000250;
  long in_stack_00000258;
  long in_stack_00000260;
  long in_stack_00000268;
  long in_stack_00000270;
  long in_stack_00000278;
  undefined8 *in_stack_00000280;
  long in_stack_00000288;
  undefined8 *in_stack_00000290;
  undefined8 *in_stack_00000298;
  long in_stack_000002a0;
  long in_stack_000002a8;
  long in_stack_000002b0;
  long in_stack_000002b8;
  long in_stack_000002c0;
  long in_stack_000002c8;
  long in_stack_000002d0;
  long in_stack_000002d8;
  long in_stack_000002e0;
  long in_stack_000002e8;
  long in_stack_000002f0;
  undefined8 *in_stack_000002f8;
  long in_stack_00000300;
  undefined8 *in_stack_00000308;
  undefined8 *in_stack_00000310;
  long in_stack_00000318;
  Array<kj::StringTree::Branch> local_3a0;
  StringTree *local_388;
  undefined8 *local_380;
  size_t local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  long local_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  long local_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  long local_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  long local_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  long local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  long local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  long local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  long local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  long local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  long local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  local_378 = this->size_;
  uStack_370 = *params;
  local_368 = *(undefined8 *)(params_1 + 8);
  uStack_360 = *(undefined8 *)(params_2 + 8);
  local_358 = *(undefined8 *)(params_3 + 8);
  uStack_350 = *(undefined8 *)(params_4 + 8);
  local_348 = *(undefined8 *)(params_5 + 8);
  uStack_340 = *(undefined8 *)(params_6 + 8);
  local_338 = *(undefined8 *)(params_7 + 8);
  uStack_330 = *params_8;
  local_328 = *(undefined8 *)(params_9 + 8);
  local_320 = *params_10;
  local_318 = *(undefined8 *)(params_11 + 8);
  uStack_310 = *(undefined8 *)(params_12 + 8);
  local_308 = *(undefined8 *)(params_13 + 8);
  uStack_300 = *(undefined8 *)(params_14 + 8);
  local_2f8 = *(undefined8 *)(params_15 + 8);
  uStack_2f0 = *(undefined8 *)(params_16 + 8);
  local_2e8 = *(undefined8 *)(params_17 + 8);
  uStack_2e0 = *params_18;
  local_2d8 = *(undefined8 *)(params_19 + 8);
  local_2d0 = *params_20;
  uStack_2c8 = *params_21;
  local_2c0 = *(undefined8 *)(params_22 + 8);
  lVar1 = 0;
  local_2b8 = *(long *)(params_23 + 8) + -1;
  if (*(long *)(params_23 + 8) == 0) {
    local_2b8 = lVar1;
  }
  local_2b0 = *(undefined8 *)(params_24 + 8);
  uStack_2a8 = *(undefined8 *)(params_25 + 8);
  local_2a0 = *(undefined8 *)(params_26 + 8);
  uStack_298 = *(undefined8 *)(params_27 + 8);
  local_290 = *(undefined8 *)(params_28 + 8);
  uStack_288 = *(undefined8 *)(params_29 + 8);
  local_280 = *(undefined8 *)(params_30 + 8);
  local_278 = *(long *)(params_31 + 8) + -1;
  if (*(long *)(params_31 + 8) == 0) {
    local_278 = lVar1;
  }
  local_270 = *(undefined8 *)(params_32 + 8);
  uStack_268 = *params_33;
  local_260 = *(undefined8 *)(params_34 + 8);
  uStack_258 = *(undefined8 *)(params_35 + 8);
  local_250 = *(undefined8 *)(params_36 + 8);
  local_248 = *params_37;
  local_240 = *(undefined8 *)(params_38 + 8);
  local_238 = *(long *)(params_39 + 8) + -1;
  if (*(long *)(params_39 + 8) == 0) {
    local_238 = lVar1;
  }
  local_230 = *(undefined8 *)(params_40 + 8);
  uStack_228 = *(undefined8 *)(params_41 + 8);
  local_220 = *(undefined8 *)(params_42 + 8);
  uStack_218 = *(undefined8 *)(params_43 + 8);
  local_210 = *(undefined8 *)(params_44 + 8);
  uStack_208 = *(undefined8 *)(params_45 + 8);
  local_200 = *(undefined8 *)(params_46 + 8);
  local_1f8 = *(long *)(params_47 + 8) + -1;
  if (*(long *)(params_47 + 8) == 0) {
    local_1f8 = lVar1;
  }
  local_1f0 = *(undefined8 *)(params_48 + 8);
  uStack_1e8 = *params_49;
  local_1e0 = *(undefined8 *)(params_50 + 8);
  uStack_1d8 = *(undefined8 *)(params_51 + 8);
  local_1d0 = *(undefined8 *)(params_52 + 8);
  local_1c8 = *params_53;
  uStack_1c0 = *params_54;
  local_1b8 = *(undefined8 *)(params_55 + 8);
  uStack_1b0 = *(undefined8 *)(params_56 + 8);
  local_1a8 = *(undefined8 *)(params_57 + 8);
  uStack_1a0 = *(undefined8 *)(params_58 + 8);
  local_198 = *(undefined8 *)(params_59 + 8);
  local_190 = *(long *)(params_60 + 8) + -1;
  if (*(long *)(params_60 + 8) == 0) {
    local_190 = lVar1;
  }
  local_188 = *(undefined8 *)(params_61 + 8);
  uStack_180 = *(undefined8 *)(params_62 + 8);
  local_178 = *(undefined8 *)(params_63 + 8);
  local_170 = *(long *)(params_64 + 8) + -1;
  if (*(long *)(params_64 + 8) == 0) {
    local_170 = lVar1;
  }
  local_168 = *(undefined8 *)(params_65 + 8);
  uStack_160 = *in_stack_000001f8;
  local_158 = *(undefined8 *)(in_stack_00000200 + 8);
  local_150 = *in_stack_00000208;
  uStack_148 = *in_stack_00000210;
  local_140 = *in_stack_00000218;
  uStack_138 = *in_stack_00000220;
  local_130 = *(undefined8 *)(in_stack_00000228 + 8);
  uStack_128 = *(undefined8 *)(in_stack_00000230 + 8);
  local_120 = *(undefined8 *)(in_stack_00000238 + 8);
  uStack_118 = *(undefined8 *)(in_stack_00000240 + 8);
  local_110 = *(undefined8 *)(in_stack_00000248 + 8);
  local_108 = *(long *)(in_stack_00000250 + 8) + -1;
  if (*(long *)(in_stack_00000250 + 8) == 0) {
    local_108 = lVar1;
  }
  local_100 = *(undefined8 *)(in_stack_00000258 + 8);
  uStack_f8 = *(undefined8 *)(in_stack_00000260 + 8);
  local_f0 = *(undefined8 *)(in_stack_00000268 + 8);
  local_e8 = *(long *)(in_stack_00000270 + 8) + -1;
  if (*(long *)(in_stack_00000270 + 8) == 0) {
    local_e8 = lVar1;
  }
  local_e0 = *(undefined8 *)(in_stack_00000278 + 8);
  uStack_d8 = *in_stack_00000280;
  local_d0 = *(undefined8 *)(in_stack_00000288 + 8);
  local_c8 = *in_stack_00000290;
  uStack_c0 = *in_stack_00000298;
  local_b8 = *(undefined8 *)(in_stack_000002a0 + 8);
  local_b0 = *(long *)(in_stack_000002a8 + 8) + -1;
  if (*(long *)(in_stack_000002a8 + 8) == 0) {
    local_b0 = lVar1;
  }
  local_a8 = *(undefined8 *)(in_stack_000002b0 + 8);
  uStack_a0 = *(undefined8 *)(in_stack_000002b8 + 8);
  local_98 = *(undefined8 *)(in_stack_000002c0 + 8);
  uStack_90 = *(undefined8 *)(in_stack_000002c8 + 8);
  local_88 = *(undefined8 *)(in_stack_000002d0 + 8);
  uStack_80 = *(undefined8 *)(in_stack_000002d8 + 8);
  local_78 = *(undefined8 *)(in_stack_000002e0 + 8);
  local_70 = *(long *)(in_stack_000002e8 + 8) + -1;
  if (*(long *)(in_stack_000002e8 + 8) == 0) {
    local_70 = lVar1;
  }
  local_68 = *(undefined8 *)(in_stack_000002f0 + 8);
  uStack_60 = *in_stack_000002f8;
  local_58 = *(undefined8 *)(in_stack_00000300 + 8);
  local_50 = *in_stack_00000308;
  uStack_48 = *in_stack_00000310;
  local_40 = *(undefined8 *)(in_stack_00000318 + 8);
  nums._M_len = (size_type)params;
  nums._M_array = (iterator)0x68;
  local_388 = this;
  local_380 = params;
  sVar2 = _::sum((_ *)&local_378,nums);
  __return_storage_ptr__->size_ = sVar2;
  local_378 = 0;
  uStack_370 = 0;
  local_368 = *(undefined8 *)(params_1 + 8);
  uStack_360 = *(undefined8 *)(params_2 + 8);
  local_358 = *(undefined8 *)(params_3 + 8);
  uStack_350 = *(undefined8 *)(params_4 + 8);
  local_348 = *(undefined8 *)(params_5 + 8);
  uStack_340 = *(undefined8 *)(params_6 + 8);
  local_338 = *(undefined8 *)(params_7 + 8);
  uStack_330 = *params_8;
  local_328 = *(undefined8 *)(params_9 + 8);
  local_320 = 0;
  local_318 = *(undefined8 *)(params_11 + 8);
  uStack_310 = *(undefined8 *)(params_12 + 8);
  local_308 = *(undefined8 *)(params_13 + 8);
  uStack_300 = *(undefined8 *)(params_14 + 8);
  local_2f8 = *(undefined8 *)(params_15 + 8);
  uStack_2f0 = *(undefined8 *)(params_16 + 8);
  local_2e8 = *(undefined8 *)(params_17 + 8);
  uStack_2e0 = *params_18;
  local_2d8 = *(undefined8 *)(params_19 + 8);
  local_2d0 = 0;
  uStack_2c8 = 0;
  local_2c0 = *(undefined8 *)(params_22 + 8);
  local_2b8 = 0;
  local_2b0 = *(undefined8 *)(params_24 + 8);
  uStack_2a8 = *(undefined8 *)(params_25 + 8);
  local_2a0 = *(undefined8 *)(params_26 + 8);
  uStack_298 = *(undefined8 *)(params_27 + 8);
  local_290 = *(undefined8 *)(params_28 + 8);
  uStack_288 = *(undefined8 *)(params_29 + 8);
  local_280 = *(undefined8 *)(params_30 + 8);
  local_278 = 0;
  local_270 = *(undefined8 *)(params_32 + 8);
  uStack_268 = *params_33;
  local_260 = *(undefined8 *)(params_34 + 8);
  uStack_258 = *(undefined8 *)(params_35 + 8);
  local_250 = *(undefined8 *)(params_36 + 8);
  local_248 = 0;
  local_240 = *(undefined8 *)(params_38 + 8);
  local_238 = 0;
  local_230 = *(undefined8 *)(params_40 + 8);
  uStack_228 = *(undefined8 *)(params_41 + 8);
  local_220 = *(undefined8 *)(params_42 + 8);
  uStack_218 = *(undefined8 *)(params_43 + 8);
  local_210 = *(undefined8 *)(params_44 + 8);
  uStack_208 = *(undefined8 *)(params_45 + 8);
  local_200 = *(undefined8 *)(params_46 + 8);
  local_1f8 = 0;
  local_1f0 = *(undefined8 *)(params_48 + 8);
  uStack_1e8 = *params_49;
  local_1e0 = *(undefined8 *)(params_50 + 8);
  uStack_1d8 = *(undefined8 *)(params_51 + 8);
  local_1d0 = *(undefined8 *)(params_52 + 8);
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1b8 = *(undefined8 *)(params_55 + 8);
  uStack_1b0 = *(undefined8 *)(params_56 + 8);
  local_1a8 = *(undefined8 *)(params_57 + 8);
  uStack_1a0 = *(undefined8 *)(params_58 + 8);
  local_198 = *(undefined8 *)(params_59 + 8);
  local_190 = 0;
  local_188 = *(undefined8 *)(params_61 + 8);
  uStack_180 = *(undefined8 *)(params_62 + 8);
  local_178 = *(undefined8 *)(params_63 + 8);
  local_170 = 0;
  local_168 = *(undefined8 *)(params_65 + 8);
  uStack_160 = *in_stack_000001f8;
  local_158 = *(undefined8 *)(in_stack_00000200 + 8);
  local_150 = 0;
  uStack_148 = 0;
  local_140 = 0;
  uStack_138 = 0;
  local_130 = *(undefined8 *)(in_stack_00000228 + 8);
  uStack_128 = *(undefined8 *)(in_stack_00000230 + 8);
  local_120 = *(undefined8 *)(in_stack_00000238 + 8);
  uStack_118 = *(undefined8 *)(in_stack_00000240 + 8);
  local_110 = *(undefined8 *)(in_stack_00000248 + 8);
  local_108 = 0;
  local_100 = *(undefined8 *)(in_stack_00000258 + 8);
  uStack_f8 = *(undefined8 *)(in_stack_00000260 + 8);
  local_f0 = *(undefined8 *)(in_stack_00000268 + 8);
  local_e8 = 0;
  local_e0 = *(undefined8 *)(in_stack_00000278 + 8);
  uStack_d8 = *in_stack_00000280;
  local_d0 = *(undefined8 *)(in_stack_00000288 + 8);
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = *(undefined8 *)(in_stack_000002a0 + 8);
  local_b0 = 0;
  local_a8 = *(undefined8 *)(in_stack_000002b0 + 8);
  uStack_a0 = *(undefined8 *)(in_stack_000002b8 + 8);
  local_98 = *(undefined8 *)(in_stack_000002c0 + 8);
  uStack_90 = *(undefined8 *)(in_stack_000002c8 + 8);
  local_88 = *(undefined8 *)(in_stack_000002d0 + 8);
  uStack_80 = *(undefined8 *)(in_stack_000002d8 + 8);
  local_78 = *(undefined8 *)(in_stack_000002e0 + 8);
  local_70 = 0;
  local_68 = *(undefined8 *)(in_stack_000002f0 + 8);
  uStack_60 = *in_stack_000002f8;
  local_58 = *(undefined8 *)(in_stack_00000300 + 8);
  local_50 = 0;
  uStack_48 = 0;
  local_40 = *(undefined8 *)(in_stack_00000318 + 8);
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0x68;
  sVar2 = _::sum((_ *)&local_378,nums_00);
  heapString((String *)&local_3a0,sVar2);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_3a0);
  Array<char>::~Array((Array<char> *)&local_3a0);
  local_378 = 1;
  uStack_370 = 1;
  local_368 = 0;
  uStack_360 = 0;
  local_358 = 0;
  uStack_350 = 0;
  local_348 = 0;
  uStack_340 = 0;
  local_338 = 0;
  uStack_330 = 0;
  local_328 = 0;
  local_320 = 1;
  local_318 = 0;
  uStack_310 = 0;
  local_308 = 0;
  uStack_300 = 0;
  local_2f8 = 0;
  uStack_2f0 = 0;
  local_2e8 = 0;
  uStack_2e0 = 0;
  local_2d8 = 0;
  local_2d0 = 1;
  uStack_2c8 = 1;
  local_2c0 = 0;
  local_2b8 = 1;
  local_2b0 = 0;
  uStack_2a8 = 0;
  local_2a0 = 0;
  uStack_298 = 0;
  local_280 = 0;
  local_290 = 0;
  uStack_288 = 0;
  local_278 = 1;
  local_260 = 0;
  uStack_258 = 0;
  local_270 = 0;
  uStack_268 = 0;
  local_250 = 0;
  local_248 = 1;
  local_240 = 0;
  local_238 = 1;
  local_230 = 0;
  uStack_228 = 0;
  local_200 = 0;
  local_220 = 0;
  uStack_218 = 0;
  local_210 = 0;
  uStack_208 = 0;
  local_1f8 = 1;
  local_1e0 = 0;
  uStack_1d8 = 0;
  local_1f0 = 0;
  uStack_1e8 = 0;
  local_1d0 = 0;
  local_1c8 = 1;
  uStack_1c0 = 1;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_198 = 0;
  local_190 = 1;
  local_188 = 0;
  uStack_180 = 0;
  local_178 = 0;
  local_170 = 1;
  local_158 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_150 = 1;
  uStack_148 = 1;
  local_140 = 1;
  uStack_138 = 1;
  local_120 = 0;
  uStack_118 = 0;
  local_130 = 0;
  uStack_128 = 0;
  local_110 = 0;
  local_108 = 1;
  local_100 = 0;
  uStack_f8 = 0;
  local_f0 = 0;
  local_e8 = 1;
  local_d0 = 0;
  local_e0 = 0;
  uStack_d8 = 0;
  local_c8 = 1;
  uStack_c0 = 1;
  local_b8 = 0;
  local_b0 = 1;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_70 = 1;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  local_50 = 1;
  uStack_48 = 1;
  local_40 = 0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0x68;
  sVar2 = _::sum((_ *)&local_378,nums_01);
  local_3a0.ptr = _::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar2);
  local_3a0.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_3a0.size_ = sVar2;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_3a0);
  Array<kj::StringTree::Branch>::~Array(&local_3a0);
  pcVar3 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar3 != (char *)0x0) {
    pcVar3 = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::Ar___pedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar3,0,local_388,local_380,params_1,params_2,params_3,params_4
             ,params_5,params_6,params_7,params_8,params_9,params_10,params_11,params_12,params_13,
             params_14,params_15,params_16,params_17,params_18,params_19,params_20,params_21,
             params_22,params_23,params_24,params_25,params_26,params_27,params_28,params_29,
             params_30,params_31,params_32,params_33,params_34,params_35,params_36,params_37,
             params_38,params_39,params_40,params_41,params_42,params_43,params_44,params_45,
             params_46,params_47,params_48,params_49,params_50,params_51,params_52,params_53,
             params_54,params_55,params_56,params_57,params_58,params_59,params_60,params_61,
             params_62,params_63);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}